

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

char * parse_hdr_field(VrplibParser *p,char *fieldname)

{
  _Bool _Var1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *__n;
  
  _Var1 = parser_match_string(p,fieldname);
  if (_Var1) {
    parser_eat_whitespaces(p);
    _Var1 = parser_match_string(p,":");
    if (_Var1) {
      pcVar3 = p->at;
      for (pcVar4 = (char *)0x0;
          ((p->base + (p->size - (long)pcVar3) != pcVar4 && (pcVar3[(long)pcVar4] != '\n')) &&
          (pcVar3[(long)pcVar4] != '\r')); pcVar4 = pcVar4 + 1) {
        p->at = pcVar3 + (long)(pcVar4 + 1);
      }
      _Var1 = parser_match_newline(p);
      if (_Var1) {
        pcVar2 = (char *)((long)pcVar4 >> 0x3f & (ulong)pcVar4);
        for (; (__n = pcVar2, 0 < (long)pcVar4 &&
               ((pcVar3[(long)(pcVar4 + -1)] == ' ' ||
                (__n = pcVar4, pcVar3[(long)(pcVar4 + -1)] == '\t')))); pcVar4 = pcVar4 + -1) {
        }
        pcVar4 = (char *)malloc((size_t)(__n + 1));
        pcVar4[(long)__n] = '\0';
        pcVar3 = strncpy(pcVar4,pcVar3,(size_t)__n);
        return pcVar3;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

static char *parse_hdr_field(VrplibParser *p, char *fieldname) {
    if (parser_match_string(p, fieldname)) {
        parser_eat_whitespaces(p);

        if (parser_match_string(p, ":")) {
            char *at = p->at;

            while (!parser_is_eof(p)) {
                bool is_newline = (*p->at == '\r' || *p->at == '\n');
                if (is_newline) {
                    break;
                }
                parser_adv(p, 1);
            }

            ptrdiff_t namesize = p->at - at;

            // Match end of line
            if (!parser_match_newline(p)) {
                return NULL;
            }

            // Walk string backwards and trim any trailing whitespace
            while (namesize > 0 &&
                   (at[namesize - 1] == ' ' || at[namesize - 1] == '\t')) {
                namesize--;
            }

            char *value = malloc(namesize + 1);
            value[namesize] = 0;
            strncpy(value, at, namesize);
            return value;
        } else {
            return NULL;
        }
    }

    return NULL;
}